

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

void __thiscall
IMLE<1,_1,_FastLinearExpert>::clusterInverseSolutions
          (IMLE<1,_1,_FastLinearExpert> *this,int newSol1,int newSol2,int worseSol)

{
  reference pFVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  ReturnType RVar2;
  Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0> PVar3;
  int j_1;
  int k_3;
  int k_2;
  Scal pSum;
  Z dist;
  int k_1;
  int j;
  int nIter;
  int k;
  ArrayZZ sum_invRp;
  Mat sol;
  Mat p;
  NoAlias<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::MatrixBase>
  in_stack_fffffffffffffbb8;
  DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *in_stack_fffffffffffffbc0;
  Inverse<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> in_stack_fffffffffffffbc8;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffbd0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
  *in_stack_fffffffffffffbd8;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  *in_stack_fffffffffffffbe0;
  plain_array<double,_1,_0,_0> in_stack_fffffffffffffbe8;
  DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
  *in_stack_fffffffffffffbf0;
  size_type in_stack_fffffffffffffbf8;
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  *in_stack_fffffffffffffc00;
  LhsNested in_stack_fffffffffffffc08;
  int local_384;
  int local_274;
  int local_24c;
  int local_134;
  int local_130;
  int local_12c;
  int local_7c;
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  local_78;
  undefined4 local_4c;
  int local_10;
  int local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffbe0,
             (int *)in_stack_fffffffffffffbd8,(int *)in_stack_fffffffffffffbd0);
  local_4c = 1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffbe0,
             (int *)in_stack_fffffffffffffbd8,(int *)in_stack_fffffffffffffbd0);
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::vector(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
           (value_type *)in_stack_fffffffffffffbf0);
  for (local_7c = 0; local_7c < *(int *)(in_RDI + 0x328) + -1; local_7c = local_7c + 1) {
    std::
    vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                  *)(in_RDI + 0x2e0),(long)local_7c);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (in_stack_fffffffffffffbd0,(Index)in_stack_fffffffffffffbc8.m_xpr);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
               in_stack_fffffffffffffbc0,
               (DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
               in_stack_fffffffffffffbb8.m_expression);
  }
  pFVar1 = std::
           vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
           ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                         *)(in_RDI + 0x98),(long)local_c);
  LinearExpert<1,_1>::getPredZ(&pFVar1->super_LinearExpert<1,_1>);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (in_stack_fffffffffffffbd0,(Index)in_stack_fffffffffffffbc8.m_xpr);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
             in_stack_fffffffffffffbc0,
             (DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
             in_stack_fffffffffffffbb8.m_expression);
  pFVar1 = std::
           vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
           ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                         *)(in_RDI + 0x98),(long)local_10);
  LinearExpert<1,_1>::getPredZ(&pFVar1->super_LinearExpert<1,_1>);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            (in_stack_fffffffffffffbd0,(Index)in_stack_fffffffffffffbc8.m_xpr);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
             in_stack_fffffffffffffbc0,
             (DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
             in_stack_fffffffffffffbb8.m_expression);
  PVar3.m_rhs = (RhsNested)in_stack_fffffffffffffc00;
  PVar3.m_lhs = in_stack_fffffffffffffc08;
  for (local_12c = 0; local_12c < *(int *)(in_RDI + 0x70); local_12c = local_12c + 1) {
    for (local_130 = 0; local_130 < *(int *)(in_RDI + 0xb0); local_130 = local_130 + 1) {
      for (local_134 = 0; local_134 < *(int *)(in_RDI + 0x328); local_134 = local_134 + 1) {
        pFVar1 = std::
                 vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                 ::operator[]((vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                               *)(in_RDI + 0x98),(long)local_130);
        LinearExpert<1,_1>::getPredZ(&pFVar1->super_LinearExpert<1,_1>);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                  (in_stack_fffffffffffffbd0,(Index)in_stack_fffffffffffffbc8.m_xpr);
        Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator-
                  ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                   in_stack_fffffffffffffbe8.array[0],in_stack_fffffffffffffbe0);
        Eigen::Matrix<double,1,1,0,1,1>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,1,0,1,1>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>>
                  ((Matrix<double,_1,_1,_0,_1,_1> *)in_stack_fffffffffffffbc0,
                   (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                    *)in_stack_fffffffffffffbb8.m_expression);
        std::
        vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                      *)(in_RDI + 0x278),(long)local_130);
        PVar3 = Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                           in_stack_fffffffffffffbc0,
                           (MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                           in_stack_fffffffffffffbb8.m_expression);
        RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::
                dot<Eigen::Product<Eigen::Matrix<double,1,1,0,1,1>,Eigen::Matrix<double,1,1,0,1,1>,0>>
                          ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                           in_stack_fffffffffffffbc0,
                           (MatrixBase<Eigen::Product<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_0>_>
                            *)in_stack_fffffffffffffbb8.m_expression);
        in_stack_fffffffffffffbe8.array[0] =
             (double  [1])exp((RVar2 * -0.5) / *(double *)(in_RDI + 0x188));
        in_stack_fffffffffffffbf0 =
             (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
             Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        in_stack_fffffffffffffbc0,(Index)in_stack_fffffffffffffbb8.m_expression,
                        0x28523e);
        *(double (*) [1])in_stack_fffffffffffffbf0 = in_stack_fffffffffffffbe8.array[0];
      }
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                (in_stack_fffffffffffffbd0,(Index)in_stack_fffffffffffffbc8.m_xpr);
      in_stack_fffffffffffffbe0 =
           (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
           Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
           sum((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
               in_stack_fffffffffffffbc8.m_xpr);
      if (0.0 < (double)in_stack_fffffffffffffbe0) {
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                  (in_stack_fffffffffffffbd0,(Index)in_stack_fffffffffffffbc8.m_xpr);
        Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
        operator/=(in_stack_fffffffffffffbf0,(Scalar *)in_stack_fffffffffffffbe8.array[0]);
      }
      for (local_24c = 0; local_24c < *(int *)(in_RDI + 0x328); local_24c = local_24c + 1) {
        in_stack_fffffffffffffbd0 =
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             std::
             vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                           *)(in_RDI + 0x278),(long)local_130);
        in_stack_fffffffffffffbd8 =
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>_>
              *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                           in_stack_fffffffffffffbc0,(Index)in_stack_fffffffffffffbb8.m_expression,
                           0x28534c);
        Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator*
                  ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)PVar3.m_lhs,
                   (double *)PVar3.m_rhs);
        std::
        vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ::operator[](&local_78,(long)local_24c);
        Eigen::MatrixBase<Eigen::Matrix<double,1,1,0,1,1>>::operator+=
                  ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)in_stack_fffffffffffffbe0,
                   in_stack_fffffffffffffbd8);
      }
    }
    for (local_274 = 0; local_274 < *(int *)(in_RDI + 0x328); local_274 = local_274 + 1) {
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::operator[](&local_78,(long)local_274);
      in_stack_fffffffffffffbc8 =
           Eigen::MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::inverse
                     ((MatrixBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)
                      in_stack_fffffffffffffbb8.m_expression);
      in_stack_fffffffffffffbc0 =
           (DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> *)(in_RDI + 0x290);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffffbd0,(Index)in_stack_fffffffffffffbc8.m_xpr);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffbd0,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *
                 )in_stack_fffffffffffffbc8.m_xpr);
      Eigen::MatrixBase<Eigen::Inverse<Eigen::Matrix<double,1,1,0,1,1>>>::operator*
                ((MatrixBase<Eigen::Inverse<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_> *)
                 in_stack_fffffffffffffbd0,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>_>
                  *)in_stack_fffffffffffffbc8.m_xpr);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffffbd0,(Index)in_stack_fffffffffffffbc8.m_xpr);
      in_stack_fffffffffffffbb8 =
           Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
           noalias((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                    *)in_stack_fffffffffffffbb8.m_expression);
      Eigen::NoAlias<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>,Eigen::MatrixBase>
      ::operator=((NoAlias<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::MatrixBase>
                   *)in_stack_fffffffffffffbe0,
                  (MatrixBase<Eigen::Product<Eigen::Inverse<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>,_0>_>
                   *)in_stack_fffffffffffffbd8);
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::operator[](&local_78,(long)local_274);
      Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::setZero(in_stack_fffffffffffffbc0);
    }
  }
  for (local_384 = 0; local_384 < *(int *)(in_RDI + 0xb0); local_384 = local_384 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (in_stack_fffffffffffffbd0,(Index)in_stack_fffffffffffffbc8.m_xpr);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x260),(long)local_384);
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>::
    maxCoeff<int>((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>
                   *)in_stack_fffffffffffffbc0,(int *)in_stack_fffffffffffffbb8.m_expression);
  }
  std::
  vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             *)0x2855b0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x2855bf);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x2855ce);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::clusterInverseSolutions(int newSol1, int newSol2, int worseSol)
{
    Mat p(M,nInvSolFound);
    Mat sol(d,nInvSolFound);
    ArrayZZ sum_invRp(nInvSolFound, zeroZZ);

    // "Educated" guesses for the nInvSolFound solutions
    for(int k = 0; k < nInvSolFound-1; k++)
        sol.col(k) = invPredictions[k];
    // Split worse solution in two
    sol.col(worseSol)    = experts[newSol1].getPredZ();
    sol.col(nInvSolFound-1) = experts[newSol2].getPredZ();

    for( int nIter = 0; nIter < param.iterMax; nIter++ )
    {
        // E-Step
        for( int j = 0; j < M; j++ )
        {
            for( int k = 0; k < nInvSolFound; k++ )
            {
                Z dist = experts[j].getPredZ() - sol.col(k);
                p(j,k) = exp(-0.5*dist.dot(iInvRj[j]*dist)/sumAll);
            }
            Scal pSum;
            if( (pSum = p.row(j).sum()) > 0.0 )
                p.row(j) /= pSum;

            for( int k = 0; k < nInvSolFound; k++ )
                sum_invRp[k] += iInvRj[j] * p(j,k);
        }
        // M-Step
        for( int k = 0; k < nInvSolFound; k++ )
        {
            /* Here I can easily implement k-means by hard assigning to most probable solution */
            sol.col(k).noalias() = sum_invRp[k].inverse() * (invRzj * p.col(k));

            // Cleaning aux variable
            sum_invRp[k].setZero();
        }
    }

    // Hard assign solutions
    for( int j = 0; j < M; j++ )
        p.row(j).maxCoeff(&sNearestInv[j]);
}